

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.cpp
# Opt level: O0

void __thiscall CorUnix::CPalObjectBase::~CPalObjectBase(CPalObjectBase *this)

{
  WCHAR *pWVar1;
  CPalObjectBase *this_local;
  
  (this->super_IPalObject)._vptr_IPalObject = (_func_int **)&PTR_GetObjectType_01dc3d20;
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if (this->m_pvImmutableData != (VOID *)0x0) {
    InternalFree(this->m_pvImmutableData);
  }
  if (this->m_pvLocalData != (VOID *)0x0) {
    InternalFree(this->m_pvLocalData);
  }
  pWVar1 = CPalString::GetString(&(this->m_oa).sObjectName);
  if (pWVar1 != (WCHAR *)0x0) {
    CPalString::FreeBuffer(&(this->m_oa).sObjectName);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CSimpleDataLock::~CSimpleDataLock(&this->m_sdlLocalData);
  return;
}

Assistant:

CPalObjectBase::~CPalObjectBase()
{
    ENTRY("CPalObjectBase::~CPalObjectBase(this = %p)\n", this);

    if (NULL != m_pvImmutableData)
    {
        InternalFree(m_pvImmutableData);
    }

    if (NULL != m_pvLocalData)
    {
        InternalFree(m_pvLocalData);
    }

    if (NULL != m_oa.sObjectName.GetString())
    {
        m_oa.sObjectName.FreeBuffer();
    }

    LOGEXIT("CPalObjectBase::~CPalObjectBase\n");
}